

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O0

int ecx_readstate(ecx_contextt *context)

{
  ushort local_1e [2];
  uint16 local_1a;
  ushort local_18;
  ec_alstatust slstat;
  uint16 rval;
  uint16 lowest;
  uint16 configadr;
  uint16 slave;
  ecx_contextt *context_local;
  
  slstat.alstatus = 0xff;
  context->slavelist->ALstatuscode = 0;
  for (slstat.alstatuscode = 1; (int)(uint)slstat.alstatuscode <= *context->slavecount;
      slstat.alstatuscode = slstat.alstatuscode + 1) {
    slstat.unused = context->slavelist[slstat.alstatuscode].configadr;
    local_1e[0] = 0;
    local_1a = 0;
    ecx_FPRD(context->port,slstat.unused,0x130,6,local_1e,6000);
    local_18 = local_1e[0];
    context->slavelist[slstat.alstatuscode].ALstatuscode = local_1a;
    if (local_1e[0] < slstat.alstatus) {
      slstat.alstatus = local_1e[0];
    }
    context->slavelist[slstat.alstatuscode].state = local_1e[0];
    context->slavelist->ALstatuscode =
         context->slavelist->ALstatuscode | context->slavelist[slstat.alstatuscode].ALstatuscode;
  }
  context->slavelist->state = slstat.alstatus;
  return (int)slstat.alstatus;
}

Assistant:

int ecx_readstate(ecx_contextt *context)
{
   uint16 slave, configadr, lowest, rval;
   ec_alstatust slstat;

   lowest = 0xff;
   context->slavelist[0].ALstatuscode = 0;
   for (slave = 1; slave <= *(context->slavecount); slave++)
   {
      configadr = context->slavelist[slave].configadr;
      slstat.alstatus = 0;
      slstat.alstatuscode = 0;
      ecx_FPRD(context->port, configadr, ECT_REG_ALSTAT, sizeof(slstat), &slstat, EC_TIMEOUTRET3);
      rval = etohs(slstat.alstatus);
      context->slavelist[slave].ALstatuscode = etohs(slstat.alstatuscode);
      if (rval < lowest)
      {
         lowest = rval;
      }
      context->slavelist[slave].state = rval;
      context->slavelist[0].ALstatuscode |= context->slavelist[slave].ALstatuscode;
   }
   context->slavelist[0].state = lowest;

   return lowest;
}